

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void __thiscall ExampleAppConsole::ExecCommand(ExampleAppConsole *this,char *command_line)

{
  ImVector<char_*> *this_00;
  int iVar1;
  char **ppcVar2;
  int i;
  uint uVar3;
  int iVar4;
  char *local_28;
  
  AddLog(this,"# %s\n",command_line);
  this->HistoryPos = -1;
  this_00 = &this->History;
  uVar3 = (this->History).Size;
  do {
    if ((int)uVar3 < 1) goto LAB_0016e904;
    uVar3 = uVar3 - 1;
    ppcVar2 = ImVector<char_*>::operator[](this_00,uVar3);
    iVar1 = Stricmp(*ppcVar2,command_line);
  } while (iVar1 != 0);
  ppcVar2 = ImVector<char_*>::operator[](this_00,uVar3);
  free(*ppcVar2);
  ImVector<char_*>::erase(this_00,(this->History).Data + uVar3);
LAB_0016e904:
  local_28 = Strdup(command_line);
  ImVector<char_*>::push_back(this_00,&local_28);
  iVar1 = Stricmp(command_line,"CLEAR");
  if (iVar1 == 0) {
    ClearLog(this);
  }
  else {
    iVar1 = Stricmp(command_line,"HELP");
    if (iVar1 == 0) {
      AddLog(this,"Commands:");
      for (iVar1 = 0; iVar1 < (this->Commands).Size; iVar1 = iVar1 + 1) {
        ppcVar2 = ImVector<const_char_*>::operator[](&this->Commands,iVar1);
        AddLog(this,"- %s",*ppcVar2);
      }
    }
    else {
      iVar1 = Stricmp(command_line,"HISTORY");
      if (iVar1 == 0) {
        iVar1 = this_00->Size;
        iVar4 = 10;
        if (10 < iVar1) {
          iVar4 = iVar1;
        }
        for (uVar3 = iVar4 - 10; (int)uVar3 < iVar1; uVar3 = uVar3 + 1) {
          ppcVar2 = ImVector<char_*>::operator[](this_00,uVar3);
          AddLog(this,"%3d: %s\n",(ulong)uVar3,*ppcVar2);
          iVar1 = (this->History).Size;
        }
      }
      else {
        AddLog(this,"Unknown command: \'%s\'\n",command_line);
      }
    }
  }
  this->ScrollToBottom = true;
  return;
}

Assistant:

void    ExecCommand(const char* command_line)
    {
        AddLog("# %s\n", command_line);

        // Insert into history. First find match and delete it so it can be pushed to the back. This isn't trying to be smart or optimal.
        HistoryPos = -1;
        for (int i = History.Size-1; i >= 0; i--)
            if (Stricmp(History[i], command_line) == 0)
            {
                free(History[i]);
                History.erase(History.begin() + i);
                break;
            }
        History.push_back(Strdup(command_line));

        // Process command
        if (Stricmp(command_line, "CLEAR") == 0)
        {
            ClearLog();
        }
        else if (Stricmp(command_line, "HELP") == 0)
        {
            AddLog("Commands:");
            for (int i = 0; i < Commands.Size; i++)
                AddLog("- %s", Commands[i]);
        }
        else if (Stricmp(command_line, "HISTORY") == 0)
        {
            int first = History.Size - 10;
            for (int i = first > 0 ? first : 0; i < History.Size; i++)
                AddLog("%3d: %s\n", i, History[i]);
        }
        else
        {
            AddLog("Unknown command: '%s'\n", command_line);
        }

        // On commad input, we scroll to bottom even if AutoScroll==false
        ScrollToBottom = true;
    }